

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

bool llbuild::buildsystem::pathIsPrefixedByPath(string *path,string *prefixPath)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  string pathSeparators;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  basic::sys::getPathSeparators_abi_cxx11_();
  uVar7 = prefixPath->_M_string_length;
  if (path->_M_string_length < uVar7) {
    bVar10 = false;
    std::__cxx11::string::substr((ulong)&local_40,(ulong)prefixPath);
    if (local_38 == path->_M_string_length) {
      if ((local_38 == 0) || (iVar3 = bcmp(local_40,(path->_M_dataplus)._M_p,local_38), iVar3 == 0))
      {
        lVar6 = std::__cxx11::string::find
                          ((char)local_60,
                           (ulong)(uint)(int)(prefixPath->_M_dataplus)._M_p
                                             [prefixPath->_M_string_length - 1]);
        bVar10 = lVar6 != -1;
      }
      else {
        bVar10 = false;
      }
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  else {
    pcVar4 = (prefixPath->_M_dataplus)._M_p;
    pcVar1 = pcVar4 + uVar7;
    pcVar8 = (path->_M_dataplus)._M_p;
    pcVar5 = pcVar4;
    pcVar9 = pcVar8;
    if (uVar7 != 0) {
      pcVar2 = pcVar8 + uVar7;
      do {
        pcVar5 = pcVar4;
        pcVar9 = pcVar8;
        if (*pcVar4 != *pcVar8) break;
        pcVar4 = pcVar4 + 1;
        pcVar8 = pcVar8 + 1;
        uVar7 = uVar7 - 1;
        pcVar5 = pcVar1;
        pcVar9 = pcVar2;
      } while (uVar7 != 0);
    }
    if (pcVar5 != pcVar1) {
      bVar10 = false;
      lVar6 = std::__cxx11::string::find((char)local_60,(ulong)(uint)(int)*pcVar5);
      if (lVar6 == -1) goto LAB_0015bb1b;
    }
    if (pcVar9 == (path->_M_dataplus)._M_p + path->_M_string_length) {
      bVar10 = true;
    }
    else {
      lVar6 = std::__cxx11::string::find((char)local_60,(ulong)(uint)(int)*pcVar9);
      bVar10 = lVar6 != -1;
    }
  }
LAB_0015bb1b:
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return bVar10;
}

Assistant:

bool llbuild::buildsystem::pathIsPrefixedByPath(std::string path,
                                                std::string prefixPath) {
  std::string pathSeparators = llbuild::basic::sys::getPathSeparators();
  // Note: GCC 4.8 doesn't support the mismatch(first1, last1, first2, last2)
  // overload, just mismatch(first1, last1, first2), so we have to handle the
  // case where prefixPath is longer than path.
  if (prefixPath.length() > path.length()) {
    // The only case where the prefix can be longer and still be a valid prefix
    // is "/foo/" is a prefix of "/foo"
    return prefixPath.substr(0, prefixPath.length() - 1) == path &&
           pathSeparators.find(prefixPath[prefixPath.length() - 1]) !=
               std::string::npos;
  }
  auto res = std::mismatch(prefixPath.begin(), prefixPath.end(), path.begin());
  // Check if `prefixPath` has been exhausted or just a separator remains.
  bool isPrefix = res.first == prefixPath.end() ||
                  (pathSeparators.find(*(res.first++)) != std::string::npos);
  // Check if `path` has been exhausted or just a separator remains.
  return isPrefix &&
         (res.second == path.end() ||
          (pathSeparators.find(*(res.second++)) != std::string::npos));
}